

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O2

FT_Error FT_Raccess_Get_HeaderInfo
                   (FT_Library library,FT_Stream stream,FT_Long rfork_offset,FT_Long *map_offset,
                   FT_Long *rdata_pos)

{
  bool bVar1;
  bool bVar2;
  FT_UInt16 FVar3;
  FT_Error FVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  FT_Error FVar8;
  long lVar9;
  uint uVar10;
  FT_ULong pos;
  uchar head [16];
  int local_4c;
  uchar head2 [16];
  ulong uVar11;
  
  FVar4 = FT_Stream_Seek(stream,rfork_offset);
  if (((FVar4 == 0) && (FVar4 = FT_Stream_Read(stream,head,0x10), FVar4 == 0)) &&
     (FVar8 = 2, FVar4 = FVar8, -1 < (char)(head[0] | head[4] | head[8] | head[0xc]))) {
    uVar5 = (ulong)head[3] |
            (ulong)((uint)head[2] << 8 | (uint)head[1] << 0x10 | (uint)head[0] << 0x18);
    *rdata_pos = uVar5;
    uVar10 = (uint)head[7] | (uint)head[6] << 8 | (uint)head[5] << 0x10 | (uint)head[4] << 0x18;
    uVar11 = (ulong)uVar10;
    if (uVar10 != 0) {
      uVar6 = (ulong)head[0xb] |
              (ulong)((uint)head[10] << 8 | (uint)head[9] << 0x10 | (uint)head[8] << 0x18);
      uVar7 = (ulong)head[0xf] |
              (ulong)((uint)head[0xe] << 8 | (uint)head[0xd] << 0x10 | (uint)head[0xc] << 0x18);
      if ((uint)uVar5 < uVar10) {
        if ((long)(uVar11 - uVar6) < (long)uVar5) {
          return 2;
        }
      }
      else if ((long)(uVar5 - uVar7) < (long)uVar11) {
        return 2;
      }
      if ((rfork_offset <= (long)(uVar6 + uVar5 ^ 0x7fffffffffffffff)) &&
         (rfork_offset <= (long)(uVar7 + uVar11 ^ 0x7fffffffffffffff))) {
        if ((uVar6 + uVar5 + rfork_offset <= stream->size) &&
           (pos = uVar11 + rfork_offset, uVar7 + pos <= stream->size)) {
          *rdata_pos = uVar5 + rfork_offset;
          FVar4 = FT_Stream_Seek(stream,pos);
          if (FVar4 == 0) {
            head2[0xf] = head[0xf] + '\x01';
            FVar4 = FT_Stream_Read(stream,head2,0x10);
            if (FVar4 == 0) {
              bVar1 = true;
              bVar2 = true;
              for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
                if (head2[lVar9] != '\0') {
                  bVar1 = false;
                }
                if (head2[lVar9] != head[lVar9]) {
                  bVar2 = false;
                }
              }
              FVar4 = FVar8;
              if (bVar1 || bVar2) {
                local_4c = FT_Stream_Skip(stream,8);
                FVar3 = FT_Stream_ReadUShort(stream,&local_4c);
                FVar4 = local_4c;
                if ((local_4c == 0) && (FVar4 = FVar8, -1 < (short)FVar3)) {
                  FVar4 = FT_Stream_Seek(stream,pos + (long)(short)FVar3);
                  if (FVar4 == 0) {
                    *map_offset = pos + (long)(short)FVar3;
                    FVar4 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return FVar4;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Raccess_Get_HeaderInfo( FT_Library  library,
                             FT_Stream   stream,
                             FT_Long     rfork_offset,
                             FT_Long    *map_offset,
                             FT_Long    *rdata_pos )
  {
    FT_Error       error;
    unsigned char  head[16], head2[16];
    FT_Long        map_pos, map_len, rdata_len;
    int            allzeros, allmatch, i;
    FT_Long        type_list;

    FT_UNUSED( library );


    error = FT_Stream_Seek( stream, (FT_ULong)rfork_offset );
    if ( error )
      return error;

    error = FT_Stream_Read( stream, (FT_Byte*)head, 16 );
    if ( error )
      return error;

    /* ensure positive values */
    if ( head[0]  >= 0x80 ||
         head[4]  >= 0x80 ||
         head[8]  >= 0x80 ||
         head[12] >= 0x80 )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos = ( head[ 0] << 24 ) |
                 ( head[ 1] << 16 ) |
                 ( head[ 2] <<  8 ) |
                   head[ 3];
    map_pos    = ( head[ 4] << 24 ) |
                 ( head[ 5] << 16 ) |
                 ( head[ 6] <<  8 ) |
                   head[ 7];
    rdata_len  = ( head[ 8] << 24 ) |
                 ( head[ 9] << 16 ) |
                 ( head[10] <<  8 ) |
                   head[11];
    map_len    = ( head[12] << 24 ) |
                 ( head[13] << 16 ) |
                 ( head[14] <<  8 ) |
                   head[15];

    /* the map must not be empty */
    if ( !map_pos )
      return FT_THROW( Unknown_File_Format );

    /* check whether rdata and map overlap */
    if ( *rdata_pos < map_pos )
    {
      if ( *rdata_pos > map_pos - rdata_len )
        return FT_THROW( Unknown_File_Format );
    }
    else
    {
      if ( map_pos > *rdata_pos - map_len )
        return FT_THROW( Unknown_File_Format );
    }

    /* check whether end of rdata or map exceeds stream size */
    if ( FT_LONG_MAX - rdata_len < *rdata_pos                               ||
         FT_LONG_MAX - map_len < map_pos                                    ||

         FT_LONG_MAX - ( *rdata_pos + rdata_len ) < rfork_offset            ||
         FT_LONG_MAX - ( map_pos + map_len ) < rfork_offset                 ||

         (FT_ULong)( rfork_offset + *rdata_pos + rdata_len ) > stream->size ||
         (FT_ULong)( rfork_offset + map_pos + map_len ) > stream->size      )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos += rfork_offset;
    map_pos    += rfork_offset;

    error = FT_Stream_Seek( stream, (FT_ULong)map_pos );
    if ( error )
      return error;

    head2[15] = (FT_Byte)( head[15] + 1 );       /* make it be different */

    error = FT_Stream_Read( stream, (FT_Byte*)head2, 16 );
    if ( error )
      return error;

    allzeros = 1;
    allmatch = 1;
    for ( i = 0; i < 16; i++ )
    {
      if ( head2[i] != 0 )
        allzeros = 0;
      if ( head2[i] != head[i] )
        allmatch = 0;
    }
    if ( !allzeros && !allmatch )
      return FT_THROW( Unknown_File_Format );

    /* If we have reached this point then it is probably a mac resource */
    /* file.  Now, does it contain any interesting resources?           */

    (void)FT_STREAM_SKIP( 4        /* skip handle to next resource map */
                          + 2      /* skip file resource number */
                          + 2 );   /* skip attributes */

    if ( FT_READ_SHORT( type_list ) )
      return error;
    if ( type_list < 0 )
      return FT_THROW( Unknown_File_Format );

    error = FT_Stream_Seek( stream, (FT_ULong)( map_pos + type_list ) );
    if ( error )
      return error;

    *map_offset = map_pos + type_list;
    return FT_Err_Ok;
  }